

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintUInt32
          (FastFieldValuePrinter *this,uint32 val,BaseTextGenerator *generator)

{
  string *in_RDX;
  uint in_stack_ffffffffffffff6c;
  BaseTextGenerator *this_00;
  AlphaNum *in_stack_ffffffffffffffa8;
  BaseTextGenerator local_38 [7];
  
  strings::AlphaNum::AlphaNum((AlphaNum *)&stack0xffffffffffffff98,in_stack_ffffffffffffff6c);
  this_00 = local_38;
  StrCat_abi_cxx11_(in_stack_ffffffffffffffa8);
  BaseTextGenerator::PrintString(this_00,in_RDX);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintUInt32(
    uint32 val, BaseTextGenerator* generator) const {
  generator->PrintString(StrCat(val));
}